

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::GlobalsScopeVariablesGroupDisplay::CreateWalker(GlobalsScopeVariablesGroupDisplay *this)

{
  LONG *pLVar1;
  VariableWalkerBase *pVVar2;
  ReferencedArenaAdapter *pRVar3;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *pWVar4;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if (this->globalsGroupWalker != (VariableWalkerBase *)0x0) {
    pRVar3 = DebugManager::GetDiagnosticArena
                       (((this->super_RecyclableObjectDisplay).scriptContext)->threadContext->
                        debugManager);
    if (pRVar3 == (ReferencedArenaAdapter *)0x0) {
      pWVar4 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
    }
    else {
      local_40 = (undefined1  [8])
                 &Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_3c7cb59;
      data.filename._0_4_ = 0x100c;
      alloc = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
      pWVar4 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
               new<Memory::HeapAllocator>(0x10,alloc,0x2f6726);
      pVVar2 = this->globalsGroupWalker;
      pWVar4->adapter = pRVar3;
      pWVar4->p = &pVVar2->super_IDiagObjectModelWalkerBase;
      LOCK();
      pLVar1 = &(pRVar3->super_RefCounted).refCount;
      *pLVar1 = *pLVar1 + 1;
      UNLOCK();
    }
    return pWVar4;
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* GlobalsScopeVariablesGroupDisplay::CreateWalker()
    {
        if (globalsGroupWalker)
        {
            ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
            if (pRefArena)
            {
                return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, globalsGroupWalker);
            }
        }
        return nullptr;
    }